

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

bool __thiscall
test_case::eval(test_case *this,ggml_backend_t backend1,ggml_backend_t backend2,char *op_name)

{
  pointer ppgVar1;
  bool bVar2;
  ggml_backend_t pgVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  ggml_context *ctx;
  ggml_cgraph *pgVar8;
  undefined4 extraout_var;
  long lVar9;
  undefined8 uVar10;
  char *__s;
  pointer ppgVar11;
  callback_userdata ud;
  ggml_backend_t local_a0 [2];
  ggml_backend_t local_90;
  ggml_backend_t local_88;
  ggml_backend_t local_80;
  undefined8 local_78;
  ggml_backend_t local_70;
  long local_68;
  undefined8 uStack_60;
  undefined1 local_58;
  long *local_50 [2];
  long local_40 [2];
  
  this->mode = MODE_TEST;
  local_80 = backend2;
  lVar7 = ggml_tensor_overhead();
  local_68 = ggml_graph_overhead();
  local_68 = local_68 + lVar7 * 0x80;
  uStack_60 = 0;
  local_58 = 1;
  ctx = (ggml_context *)ggml_init();
  if (ctx == (ggml_context *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-backend-ops.cpp"
               ,0x1bc,"GGML_ASSERT(%s) failed","ctx");
  }
  pgVar8 = (ggml_cgraph *)ggml_new_graph(ctx);
  this->gf = pgVar8;
  add_sentinel(this,ctx);
  iVar6 = (*this->_vptr_test_case[4])(this,ctx);
  uVar10 = CONCAT44(extraout_var,iVar6);
  if (op_name != (char *)0x0) {
    (*this->_vptr_test_case[2])(local_a0,this,uVar10);
    iVar6 = std::__cxx11::string::compare((char *)local_a0);
    if (local_a0[0] != (ggml_backend_t)&local_90) {
      operator_delete(local_a0[0],(long)local_90 + 1);
    }
    if (iVar6 != 0) goto LAB_0012849c;
  }
  local_78 = uVar10;
  (*this->_vptr_test_case[2])(local_a0,this,uVar10);
  pgVar3 = local_a0[0];
  (*this->_vptr_test_case[3])(local_50,this);
  printf("  %s(%s): ",pgVar3,local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_a0[0] != (ggml_backend_t)&local_90) {
    operator_delete(local_a0[0],(long)local_90 + 1);
  }
  fflush(_stdout);
  local_a0[0] = backend1;
  local_a0[1] = local_80;
  bVar2 = true;
  lVar7 = 0;
  local_70 = backend1;
LAB_001283ca:
  do {
    uVar10 = *(undefined8 *)((long)local_a0 + lVar7);
    for (lVar9 = ggml_get_first_tensor(ctx); lVar9 != 0; lVar9 = ggml_get_next_tensor(ctx,lVar9)) {
      cVar4 = ggml_backend_supports_op(uVar10,lVar9);
      if (cVar4 == '\0') {
        uVar10 = ggml_backend_name(uVar10);
        bVar2 = false;
        printf("not supported [%s] ",uVar10);
        lVar7 = lVar7 + 8;
        if (lVar7 == 0x10) goto LAB_00128492;
        goto LAB_001283ca;
      }
    }
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x10);
  if (bVar2) {
    add_sentinel(this,ctx);
    pgVar3 = local_70;
    lVar7 = ggml_backend_alloc_ctx_tensors(ctx,local_70);
    if (lVar7 != 0) {
      ggml_build_forward_expand(this->gf,local_78);
      ppgVar1 = (this->sentinels).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppgVar11 = (this->sentinels).
                      super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppgVar11 != ppgVar1; ppgVar11 = ppgVar11 + 1
          ) {
        ggml_graph_add_node(this->gf,*ppgVar11);
      }
      (*this->_vptr_test_case[0xb])(this,ctx);
      local_a0[0] = (ggml_backend_t)CONCAT71(local_a0[0]._1_7_,1);
      (*this->_vptr_test_case[5])(this);
      local_90 = pgVar3;
      local_88 = local_80;
      bVar5 = ggml_backend_compare_graph_backend
                        (pgVar3,local_80,this->gf,eval::anon_class_1_0_00000001::__invoke,local_a0);
      if (bVar5 == 0) {
        printf("compare failed ");
      }
      ggml_backend_buffer_free(lVar7);
      ggml_free(ctx);
      bVar5 = (byte)local_a0[0] & bVar5;
      __s = "\x1b[1;31mFAIL\x1b[0m";
      if (bVar5 != 0) {
        __s = "\x1b[1;32mOK\x1b[0m";
      }
      puts(__s);
      return (bool)bVar5;
    }
    uVar10 = ggml_backend_name(pgVar3);
    printf("failed to allocate tensors [%s] ",uVar10);
    ggml_free(ctx);
    return false;
  }
LAB_00128492:
  putchar(10);
LAB_0012849c:
  ggml_free(ctx);
  return true;
}

Assistant:

bool eval(ggml_backend_t backend1, ggml_backend_t backend2, const char * op_name) {
        mode = MODE_TEST;

        ggml_init_params params = {
            /* .mem_size = */ ggml_tensor_overhead()*128 + ggml_graph_overhead(),
            /* .mem_base = */ NULL,
            /* .no_alloc = */ true,
        };
        ggml_context * ctx = ggml_init(params);
        GGML_ASSERT(ctx);

        gf = ggml_new_graph(ctx);

        // pre-graph sentinel
        add_sentinel(ctx);

        ggml_tensor * out = build_graph(ctx);

        if (op_name != nullptr && op_desc(out) != op_name) {
            //printf("  %s: skipping\n", op_desc(out).c_str());
            ggml_free(ctx);
            return true;
        }

        printf("  %s(%s): ", op_desc(out).c_str(), vars().c_str());
        fflush(stdout);

        // check if the backends support the ops
        bool supported = true;
        for (ggml_backend_t backend : {backend1, backend2}) {
            for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
                if (!ggml_backend_supports_op(backend, t)) {
                    printf("not supported [%s] ", ggml_backend_name(backend));
                    supported = false;
                    break;
                }
            }
        }
        if (!supported) {
            printf("\n");
            ggml_free(ctx);
            return true;
        }

        // post-graph sentinel
        add_sentinel(ctx);

        // allocate
        ggml_backend_buffer_t buf = ggml_backend_alloc_ctx_tensors(ctx, backend1);

        if (buf == NULL) {
            printf("failed to allocate tensors [%s] ", ggml_backend_name(backend1));
            ggml_free(ctx);
            return false;
        }

        // build graph
        ggml_build_forward_expand(gf, out);

        // add sentinels as graph nodes so that they are checked in the callback
        for (ggml_tensor * sentinel : sentinels) {
            ggml_graph_add_node(gf, sentinel);
        }

        // randomize tensors
        initialize_tensors(ctx);

        // compare
        struct callback_userdata {
            bool   ok;
            double max_err;
            ggml_backend_t backend1;
            ggml_backend_t backend2;
        };

        callback_userdata ud {
            true,
            max_nmse_err(),
            backend1,
            backend2
        };

        auto callback = [](int index, ggml_tensor * t1, ggml_tensor * t2, void * user_data) -> bool {
            callback_userdata * ud = (callback_userdata *) user_data;
            const char * bn1 = ggml_backend_name(ud->backend1);
            const char * bn2 = ggml_backend_name(ud->backend2);

            if (t1->op == GGML_OP_NONE) {
                // sentinels must be unchanged
                std::vector<uint8_t> t1_data(ggml_nbytes(t1));
                std::vector<uint8_t> t2_data(ggml_nbytes(t2));
                ggml_backend_tensor_get(t1, t1_data.data(), 0, ggml_nbytes(t1));
                ggml_backend_tensor_get(t2, t2_data.data(), 0, ggml_nbytes(t2));

                if (memcmp(t1_data.data(), t2_data.data(), ggml_nbytes(t1)) != 0) {
                    printf("sentinel mismatch: %s ", t1->name);
                    ud->ok = false;
                    return true;
                }
            }

            std::vector<float> f1 = tensor_to_float(t1);
            std::vector<float> f2 = tensor_to_float(t2);

            for (size_t i = 0; i < f1.size(); i++) {
                // check for nans
                if (std::isnan(f1[i]) || std::isnan(f2[i])) {
                    printf("[%s] NaN at index %zu (%s=%f %s=%f) ", ggml_op_desc(t1), i, bn1, f1[i], bn2, f2[i]);
                    ud->ok = false;
                    return true;
                }
                // check for infs: both must be inf of the same sign, or both must be finite
                if (isinf_or_max(f1[i]) || isinf_or_max(f2[i])) {
                    if (isinf_or_max(f1[i]) && isinf_or_max(f2[i])) {
                        if (std::signbit(f1[i]) != std::signbit(f2[i])) {
                            printf("[%s] inf sign mismatch: %s=%f %s=%f ", ggml_op_desc(t1), bn1, f1[i], bn2, f2[i]);
                            ud->ok = false;
                            return true;
                        }
                    } else {
                        printf("[%s] inf mismatch: %s=%f %s=%f ", ggml_op_desc(t1), bn1, f1[i], bn2, f2[i]);
                        ud->ok = false;
                        return true;
                    }
                }
            }

            double err = nmse(f1.data(), f2.data(), f1.size());
            if (err > ud->max_err) {
                printf("[%s] NMSE = %.9f > %.9f ", ggml_op_desc(t1), err, ud->max_err);
                //for (int i = 0; i < (int) f1.size(); i++) {
                //    printf("%5d %9.6f %9.6f, diff = %9.6f\n", i, f1[i], f2[i], f1[i] - f2[i]);
                //}
                //printf("\n");
                //exit(1);
                ud->ok = false;
            }
            return true;

            GGML_UNUSED(index);
        };

        const bool cmp_ok = ggml_backend_compare_graph_backend(backend1, backend2, gf, callback, &ud);

        if (!cmp_ok) {
            printf("compare failed ");
        }

        ggml_backend_buffer_free(buf);

        ggml_free(ctx);

        if (ud.ok && cmp_ok) {
            printf("\033[1;32mOK\033[0m\n");
            return true;
        }

        printf("\033[1;31mFAIL\033[0m\n");
        return false;
    }